

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

int run_test_fs_event_watch_invalid_path(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop_00;
  int r;
  uv_loop_t *loop;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x48c,"r == 0");
    abort();
  }
  iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x48e,"r != 0");
    abort();
  }
  iVar1 = uv_is_active(&fs_event);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x48f,"uv_is_active((uv_handle_t*) &fs_event) == 0");
    abort();
  }
  iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x491,"r != 0");
    abort();
  }
  iVar1 = uv_is_active(&fs_event);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x492,"uv_is_active((uv_handle_t*) &fs_event) == 0");
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  close_loop(loop_00);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x493,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_event_watch_invalid_path) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "<:;", 0);
  ASSERT(r != 0);
  ASSERT(uv_is_active((uv_handle_t*) &fs_event) == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "", 0);
  ASSERT(r != 0);
  ASSERT(uv_is_active((uv_handle_t*) &fs_event) == 0);
  MAKE_VALGRIND_HAPPY();
  return 0;
}